

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O2

void __thiscall Buffer::Update(Buffer *this,iterator it)

{
  int pos;
  int local_1c;
  
  local_1c = *(int *)&it._M_node[1]._M_next;
  std::__cxx11::list<int,_std::allocator<int>_>::erase
            (&this->Occupy_Block,(const_iterator)it._M_node);
  std::__cxx11::list<int,_std::allocator<int>_>::push_back(&this->Occupy_Block,&local_1c);
  this->Dirty[local_1c] = 1;
  this->Pin[local_1c] = 0;
  return;
}

Assistant:

void Buffer::Update(list<int>::iterator it) {
	int pos = *it;
	it = this->Occupy_Block.erase(it);
	this->Occupy_Block.push_back(pos);
	this->Dirt(pos);
	this->UnLock(pos);							//������棬���Ա��滻��ȥ
}